

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

void __thiscall
google::protobuf::
MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
::MapPair(MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
          *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *other_first)

{
  pointer pcVar1;
  
  (this->first)._M_dataplus._M_p = (pointer)&(this->first).field_2;
  pcVar1 = (other_first->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + other_first->_M_string_length);
  CoreML::Specification::MILSpec::Argument::Argument(&this->second);
  return;
}

Assistant:

explicit MapPair(const Key& other_first) : first(other_first), second() {}